

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_inst.c
# Opt level: O1

void if_op(vm *v,instruction *inst)

{
  type_pointer pfVar1;
  uint32 *puVar2;
  int *piVar3;
  type_pointer pfVar4;
  func_type bt_00;
  _Bool _Var5;
  long lVar6;
  vec *instructions;
  func_type bt;
  undefined8 local_38;
  byte *pbStack_30;
  undefined8 local_28;
  byte *pbStack_20;
  
  piVar3 = (int *)inst->arg;
  lVar6 = (long)*piVar3;
  local_28 = 1;
  pbStack_20 = (byte *)0x0;
  local_38 = 0;
  pbStack_30 = (byte *)0x0;
  if (lVar6 < 0) {
    switch(*piVar3) {
    case -4:
      pbStack_30 = fiveBlockReturnType + 3;
      break;
    case -3:
      pbStack_30 = fiveBlockReturnType + 2;
      break;
    case -2:
      pbStack_30 = fiveBlockReturnType + 1;
      break;
    case -1:
      pbStack_30 = fiveBlockReturnType;
      break;
    default:
      local_28 = 0;
    }
  }
  else {
    pfVar4 = (v->m->type_sec).type_segment_addr;
    pfVar1 = pfVar4 + lVar6;
    local_38 = *(undefined8 *)pfVar1;
    pbStack_30 = pfVar1->param_types;
    puVar2 = &pfVar4[lVar6].return_count;
    local_28 = *(undefined8 *)puVar2;
    pbStack_20 = *(byte **)(puVar2 + 2);
  }
  _Var5 = popBool(&v->operandStack);
  instructions = (vec *)(piVar3 + 2);
  if (!_Var5) {
    instructions = (vec *)(piVar3 + 0x16);
  }
  bt_00.param_types = pbStack_30;
  bt_00._0_8_ = local_38;
  bt_00._16_8_ = local_28;
  bt_00.return_types = pbStack_20;
  enterBlock(v,'\x04',bt_00,instructions);
  return;
}

Assistant:

void if_op(vm *v, instruction *inst) {
    ifArgs *ia = (ifArgs *) inst->arg;
    func_type bt = get_block_type(v, ia->blockType);
    bool if_true = popBool(&v->operandStack);
    if (if_true) {
        enterBlock(v, If, bt, &ia->instructions1);
    } else {
        enterBlock(v, If, bt, &ia->instructions2);
    }
}